

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.c
# Opt level: O0

uint64_t sx_tm_laptime(uint64_t *last_ticks)

{
  uint64_t uVar1;
  uint64_t *last_ticks_local;
  
  uVar1 = stm_laptime(last_ticks);
  return uVar1;
}

Assistant:

uint64_t sx_tm_laptime(uint64_t* last_ticks)
{
    return stm_laptime(last_ticks);
}